

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Promise<capnp::AnyPointer::Pipeline> __thiscall
capnp::LocalCallContext::onTailCall(LocalCallContext *this)

{
  SourceLocation location;
  Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_std::nullptr_t> *t;
  Promise<capnp::AnyPointer::Pipeline> *pPVar1;
  long in_RSI;
  LocalCallContext *this_00;
  Maybe<kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_std::nullptr_t>_> local_60;
  SourceLocation local_48;
  undefined1 local_30 [8];
  PromiseFulfillerPair<capnp::AnyPointer::Pipeline> paf;
  LocalCallContext *this_local;
  
  this_00 = this;
  kj::SourceLocation::SourceLocation
            (&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
             ,"onTailCall",0xce,0x10);
  location.function = (char *)local_48._16_8_;
  location.fileName = local_48.function;
  location._16_8_ = this_00;
  kj::newPromiseAndFulfiller<capnp::AnyPointer::Pipeline>(location);
  t = kj::mv<kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,decltype(nullptr)>>
                ((Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_std::nullptr_t> *)&paf);
  kj::Maybe<kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_std::nullptr_t>_>::Maybe
            (&local_60,t);
  kj::Maybe<kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_std::nullptr_t>_>::operator=
            ((Maybe<kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_std::nullptr_t>_> *)
             (in_RSI + 0x90),&local_60);
  kj::Maybe<kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_std::nullptr_t>_>::~Maybe
            (&local_60);
  pPVar1 = kj::mv<kj::Promise<capnp::AnyPointer::Pipeline>>
                     ((Promise<capnp::AnyPointer::Pipeline> *)local_30);
  kj::Promise<capnp::AnyPointer::Pipeline>::Promise
            ((Promise<capnp::AnyPointer::Pipeline> *)this_00,pPVar1);
  kj::PromiseFulfillerPair<capnp::AnyPointer::Pipeline>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<capnp::AnyPointer::Pipeline> *)local_30);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<AnyPointer::Pipeline> onTailCall() override {
    auto paf = kj::newPromiseAndFulfiller<AnyPointer::Pipeline>();
    tailCallPipelineFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }